

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O1

void __thiscall
soplex::SPxGeometSC<double>::scale(SPxGeometSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  SPxOut *pSVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  char cVar2;
  pointer pdVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Verbosity old_verbosity_2;
  vector<double,_std::allocator<double>_> rowscale;
  vector<double,_std::allocator<double>_> colscale;
  undefined4 local_ec;
  value_type_conflict1 local_e8;
  Real local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (2 < (int)pSVar1->m_verbosity)) {
    local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,3);
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"Geometric scaling LP",0x14);
    pcVar11 = " (persistent)";
    if (!persistent) {
      pcVar11 = "";
    }
    lVar7 = 0xd;
    if (!persistent) {
      lVar7 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],pcVar11,lVar7);
    pcVar11 = " with post-equilibration";
    bVar13 = this->postequilibration == false;
    if (bVar13) {
      pcVar11 = "";
    }
    lVar7 = 0x18;
    if (bVar13) {
      lVar7 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],pcVar11,lVar7);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_d8);
  }
  (**(this->super_SPxScaler<double>)._vptr_SPxScaler)(this,lp);
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
  local_b8 = extraout_XMM0_Qa;
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
  this_00 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_c0 = extraout_XMM0_Qa_00;
  local_e0 = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_78 = local_c0;
  if (local_c0 <= local_b8) {
    local_78 = local_b8;
  }
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  uStack_70 = 0;
  if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
    local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,4);
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," min= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," col-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," row-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_c0);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_d8);
  }
  local_88 = this->m_goodEnoughRatio;
  bVar13 = local_88 < local_78;
  if (local_78 <= local_88) {
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,4);
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = pSVar1->m_verbosity;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],
                 "No geometric scaling done, ratio good enough",0x2c);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_d8);
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,4);
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = pSVar1->m_verbosity;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],
                 " ... but will still perform equilibrium scaling",0x2f);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_d8);
    }
  }
  local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d8,
             (ulong)(uint)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
             (value_type_conflict1 *)&local_a0,(allocator_type *)&local_e8);
  local_e8 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_a0,
             (ulong)(uint)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
             &local_e8,(allocator_type *)&local_ec);
  if (local_88 < local_78) {
    local_58 = local_b8;
    if (local_c0 <= local_b8) {
      local_58 = local_c0;
    }
    uStack_50 = 0;
    if (this->m_maxIterations < 1) {
      local_88 = 0.0;
      uStack_80 = 0;
      dVar17 = 0.0;
    }
    else {
      iVar10 = 0;
      uStack_80 = 0;
      dVar17 = local_78;
      local_88 = local_58;
      do {
        local_60 = local_88;
        local_68 = dVar17;
        if (local_c0 <= local_b8) {
          local_b0 = computeScalingVec<double>((SVSetBase<double> *)lp,&local_a0,&local_d8,local_e0)
          ;
          local_48 = computeScalingVec<double>
                               (&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,&local_d8,
                                &local_a0,local_e0);
          local_88 = local_b0;
          local_a8 = local_48;
        }
        else {
          local_a8 = computeScalingVec<double>
                               (&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,&local_d8,
                                &local_a0,local_e0);
          local_48 = computeScalingVec<double>((SVSetBase<double> *)lp,&local_a0,&local_d8,local_e0)
          ;
          local_88 = local_a8;
          local_b0 = local_48;
        }
        uStack_80 = 0;
        uStack_40 = 0;
        pSVar1 = (this->super_SPxScaler<double>).spxout;
        if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
          local_e8 = (value_type_conflict1)CONCAT44(local_e8._4_4_,pSVar1->m_verbosity);
          local_ec = 5;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_ec);
          pSVar1 = (this->super_SPxScaler<double>).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar1->m_streams[pSVar1->m_verbosity],"Geometric scaling round ",0x18);
          std::ostream::operator<<((ostream *)pSVar1->m_streams[pSVar1->m_verbosity],iVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar1->m_streams[pSVar1->m_verbosity]," col-ratio= ",0xc);
          std::ostream::_M_insert<double>(local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar1->m_streams[pSVar1->m_verbosity]," row-ratio= ",0xc);
          std::ostream::_M_insert<double>(local_b0);
          cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          (*((this->super_SPxScaler<double>).spxout)->_vptr_SPxOut[2])();
        }
        dVar17 = local_48;
      } while (((local_88 <= local_60 * this->m_minImprovement) ||
               (local_48 <= local_68 * this->m_minImprovement)) &&
              (iVar10 = iVar10 + 1, iVar10 < this->m_maxIterations));
    }
    bVar13 = dVar17 <= local_78 * this->m_minImprovement ||
             local_88 <= local_58 * this->m_minImprovement;
  }
  auVar6 = _DAT_00601040;
  auVar5 = _DAT_00601030;
  if ((bVar13) || (this->postequilibration != false)) {
    vecExp = (this->super_SPxScaler<double>).m_activeColscaleExp;
    vecExp_00 = (this->super_SPxScaler<double>).m_activeRowscaleExp;
    if (this->postequilibration == true) {
      if (!bVar13) {
        pdVar3 = (pointer)CONCAT44(local_d8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (Verbosity)
                                   local_d8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        if (pdVar3 != local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          uVar8 = (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + (-8 - (long)pdVar3);
          auVar19._8_4_ = (int)uVar8;
          auVar19._0_8_ = uVar8;
          auVar19._12_4_ = (int)(uVar8 >> 0x20);
          auVar14._0_8_ = uVar8 >> 3;
          auVar14._8_8_ = auVar19._8_8_ >> 3;
          uVar12 = 0;
          auVar14 = auVar14 ^ _DAT_00601040;
          do {
            auVar18._8_4_ = (int)uVar12;
            auVar18._0_8_ = uVar12;
            auVar18._12_4_ = (int)(uVar12 >> 0x20);
            auVar19 = (auVar18 | auVar5) ^ auVar6;
            if ((bool)(~(auVar19._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar19._0_4_ ||
                        auVar14._4_4_ < auVar19._4_4_) & 1)) {
              pdVar3[uVar12] = 1.0;
            }
            if ((auVar19._12_4_ != auVar14._12_4_ || auVar19._8_4_ <= auVar14._8_4_) &&
                auVar19._12_4_ <= auVar14._12_4_) {
              pdVar3[uVar12 + 1] = 1.0;
            }
            uVar12 = uVar12 + 2;
          } while (((uVar8 >> 3) + 2 & 0x3ffffffffffffffe) != uVar12);
        }
        auVar6 = _DAT_00601040;
        auVar5 = _DAT_00601030;
        if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          puVar9 = (undefined1 *)
                   ((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                   (-8 - (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start));
          auVar15._8_4_ = (int)puVar9;
          auVar15._0_8_ = puVar9;
          auVar15._12_4_ = (int)((ulong)puVar9 >> 0x20);
          auVar16._0_8_ = (ulong)puVar9 >> 3;
          auVar16._8_8_ = auVar15._8_8_ >> 3;
          uVar8 = 0;
          auVar16 = auVar16 ^ _DAT_00601040;
          do {
            auVar20._8_4_ = (int)uVar8;
            auVar20._0_8_ = uVar8;
            auVar20._12_4_ = (int)(uVar8 >> 0x20);
            auVar19 = (auVar20 | auVar5) ^ auVar6;
            if ((bool)(~(auVar19._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar19._0_4_ ||
                        auVar16._4_4_ < auVar19._4_4_) & 1)) {
              local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = 1.0;
            }
            if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
                auVar19._12_4_ <= auVar16._12_4_) {
              local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8 + 1] = 1.0;
            }
            uVar8 = uVar8 + 2;
          } while ((((ulong)puVar9 >> 3) + 2 & 0x3ffffffffffffffe) != uVar8);
        }
      }
      SPxEquiliSC<double>::computePostequiExpVecs(lp,&local_d8,&local_a0,vecExp_00,vecExp,local_e0);
    }
    else {
      SPxScaler<double>::computeExpVec(&this->super_SPxScaler<double>,&local_a0,vecExp);
      SPxScaler<double>::computeExpVec(&this->super_SPxScaler<double>,&local_d8,vecExp_00);
    }
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[2])(this,lp);
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      local_e8 = (value_type_conflict1)CONCAT44(local_e8._4_4_,pSVar1->m_verbosity);
      local_ec = 5;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"Row scaling min= ",0x11);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x31])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x32])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"IGEOSC06 Col scaling min= ",0x1a);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x2f])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_05);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x30])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_06);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_e8);
    }
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
      local_e8 = (value_type_conflict1)CONCAT44(local_e8._4_4_,pSVar1->m_verbosity);
      local_ec = 4;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," min= ",6);
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,0);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_07);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,0);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_08);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," col-ratio= ",0xc);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_09);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," row-ratio= ",0xc);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_10);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_e8);
    }
  }
  else {
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
      local_e8 = (value_type_conflict1)CONCAT44(local_e8._4_4_,pSVar1->m_verbosity);
      local_ec = 4;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"No geometric scaling done.",0x1a);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_e8);
    }
    lp->_isScaled = true;
  }
  if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (Verbosity)
                            local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_d8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}